

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O2

TermSpec * __thiscall Kernel::RobSubstitution::derefBound(RobSubstitution *this,TermSpec *t_)

{
  TermSpec *pTVar1;
  Option<const_Kernel::TermSpec_&> binding;
  TermSpec *local_38;
  ulong local_30;
  int local_28;
  
  do {
    pTVar1 = t_;
    local_30 = (pTVar1->term)._content;
    if ((local_30 & 3) == 0) {
      return pTVar1;
    }
    local_28 = pTVar1->index;
    Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::find
              ((DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               &local_38,(VarSpec *)&this->_bindings);
    t_ = local_38;
  } while (local_38 != (TermSpec *)0x0);
  return pTVar1;
}

Assistant:

TermSpec const& RobSubstitution::derefBound(TermSpec const& t_) const
{
  TermSpec const* t = &t_;
  for(;;) {
    if (t->isTerm()) {
      return *t;
    } else {
      auto binding = _bindings.find(t->varSpec());
      if (!binding) {
        return *t;
      } else {
        t = &binding.unwrap();
      }
    }
  }
}